

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall crnlib::dynamic_string::toupper(dynamic_string *this,int __c)

{
  char *p;
  dynamic_string *this_local;
  
  if (this->m_len != 0) {
    p = get_ptr_priv(this);
    strupr(p);
  }
  return (int)this;
}

Assistant:

dynamic_string& dynamic_string::toupper()
    {
        if (m_len)
        {
#if defined(CRN_CC_MSVC)
            _strupr_s(get_ptr_priv(), m_buf_size);
#else
            strupr(get_ptr_priv());
#endif
        }
        return *this;
    }